

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O2

size_t HUF_decompress4X2_usingDTable_internal_fast
                 (void *dst,size_t dstSize,void *cSrc,size_t cSrcSize,HUF_DTable *DTable,
                 HUF_DecompressFastLoopFn loopFn)

{
  BYTE *pBVar1;
  long lVar2;
  long lVar3;
  size_t sVar4;
  ulong uVar5;
  uint uVar6;
  BYTE *pBVar7;
  ulong uVar8;
  int iVar9;
  uint uVar10;
  ulong uVar11;
  long lVar12;
  BYTE *pBVar13;
  bool bVar14;
  BIT_DStream_t local_108;
  size_t local_e0;
  ulong local_d8;
  BYTE *local_d0;
  HUF_DecompressFastArgs args;
  
  sVar4 = HUF_DecompressFastArgs_init(&args,dst,dstSize,cSrc,cSrcSize,DTable);
  if (sVar4 - 1 < 0xffffffffffffff88) {
    if (args.ip[0] < args.ilimit) {
      __assert_fail("args.ip[0] >= args.ilimit",
                    "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                    ,0x928e,
                    "size_t HUF_decompress4X2_usingDTable_internal_fast(void *, size_t, const void *, size_t, const HUF_DTable *, HUF_DecompressFastLoopFn)"
                   );
    }
    pBVar13 = (BYTE *)((long)cSrc + 6);
    HUF_decompress4X2_usingDTable_internal_fast_c_loop(&args);
    if (args.ip[0] < pBVar13) {
      __assert_fail("args.ip[0] >= iend",
                    "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                    ,0x9292,
                    "size_t HUF_decompress4X2_usingDTable_internal_fast(void *, size_t, const void *, size_t, const HUF_DTable *, HUF_DecompressFastLoopFn)"
                   );
    }
    if (args.ip[1] < pBVar13) {
      __assert_fail("args.ip[1] >= iend",
                    "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                    ,0x9293,
                    "size_t HUF_decompress4X2_usingDTable_internal_fast(void *, size_t, const void *, size_t, const HUF_DTable *, HUF_DecompressFastLoopFn)"
                   );
    }
    if (args.ip[2] < pBVar13) {
      __assert_fail("args.ip[2] >= iend",
                    "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                    ,0x9294,
                    "size_t HUF_decompress4X2_usingDTable_internal_fast(void *, size_t, const void *, size_t, const HUF_DTable *, HUF_DecompressFastLoopFn)"
                   );
    }
    if (args.ip[3] < pBVar13) {
      __assert_fail("args.ip[3] >= iend",
                    "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                    ,0x9295,
                    "size_t HUF_decompress4X2_usingDTable_internal_fast(void *, size_t, const void *, size_t, const HUF_DTable *, HUF_DecompressFastLoopFn)"
                   );
    }
    local_d0 = (BYTE *)((long)dst + dstSize);
    if (local_d0 < args.op[3]) {
      __assert_fail("args.op[3] <= oend",
                    "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                    ,0x9296,
                    "size_t HUF_decompress4X2_usingDTable_internal_fast(void *, size_t, const void *, size_t, const HUF_DTable *, HUF_DecompressFastLoopFn)"
                   );
    }
    local_d8 = dstSize + 3 >> 2;
    lVar12 = 0;
    local_e0 = dstSize;
    do {
      if (lVar12 == 4) {
        return local_e0;
      }
      uVar5 = (long)local_d0 - (long)dst;
      dst = (BYTE *)((long)dst + local_d8);
      if (uVar5 < local_d8) {
        dst = local_d0;
      }
      sVar4 = HUF_initRemainingDStream(&local_108,&args,(int)lVar12,(BYTE *)dst);
      if (0xffffffffffffff88 < sVar4) {
        return sVar4;
      }
      pBVar13 = args.op[lVar12];
      uVar8 = (long)dst - (long)pBVar13;
      uVar5 = (ulong)local_108.bitsConsumed;
      iVar9 = (int)local_108.start;
      pBVar7 = pBVar13;
      if (uVar8 < 8) {
        if (local_108.bitsConsumed < 0x41) {
          if (local_108.ptr < local_108.limitPtr) {
            if (local_108.ptr == local_108.start) goto LAB_001de579;
            uVar6 = (int)local_108.ptr - iVar9;
            if (local_108.start <=
                (size_t *)((long)local_108.ptr - (ulong)(local_108.bitsConsumed >> 3))) {
              uVar6 = local_108.bitsConsumed >> 3;
            }
            local_108.bitsConsumed = local_108.bitsConsumed + uVar6 * -8;
          }
          else {
            uVar6 = local_108.bitsConsumed >> 3;
            local_108.bitsConsumed = local_108.bitsConsumed & 7;
          }
          local_108.ptr = (char *)((long)local_108.ptr - (ulong)uVar6);
          uVar5 = (ulong)local_108.bitsConsumed;
          local_108.bitContainer = *(size_t *)local_108.ptr;
        }
      }
      else {
        while (uVar6 = (uint)uVar5, uVar6 < 0x41) {
          if (local_108.ptr < local_108.limitPtr) {
            if (local_108.ptr == local_108.start) break;
            bVar14 = local_108.start <= (size_t *)((long)local_108.ptr - (uVar5 >> 3));
            uVar10 = (int)local_108.ptr - iVar9;
            if (bVar14) {
              uVar10 = (uint)(uVar5 >> 3);
            }
            uVar6 = uVar6 + uVar10 * -8;
          }
          else {
            uVar10 = (uint)(uVar5 >> 3);
            uVar6 = uVar6 & 7;
            bVar14 = true;
          }
          uVar5 = (ulong)uVar6;
          local_108.ptr = (char *)((long)local_108.ptr - (ulong)uVar10);
          local_108.bitContainer = *(size_t *)local_108.ptr;
          if (((BYTE *)((long)dst + -9) <= pBVar7) || (!bVar14)) break;
          uVar5 = (local_108.bitContainer << (uVar5 & 0x3f)) >> 0x35;
          *(short *)pBVar7 = (short)DTable[uVar5 + 1];
          uVar6 = *(byte *)((long)DTable + uVar5 * 4 + 6) + uVar6;
          uVar5 = (ulong)*(byte *)((long)DTable + uVar5 * 4 + 7);
          uVar8 = (local_108.bitContainer << ((ulong)uVar6 & 0x3f)) >> 0x35;
          *(short *)(pBVar7 + uVar5) = (short)DTable[uVar8 + 1];
          uVar6 = *(byte *)((long)DTable + uVar8 * 4 + 6) + uVar6;
          uVar8 = (ulong)*(byte *)((long)DTable + uVar8 * 4 + 7);
          lVar2 = uVar8 + uVar5;
          uVar11 = (local_108.bitContainer << ((ulong)uVar6 & 0x3f)) >> 0x35;
          *(short *)(pBVar7 + uVar8 + uVar5) = (short)DTable[uVar11 + 1];
          uVar6 = *(byte *)((long)DTable + uVar11 * 4 + 6) + uVar6;
          uVar5 = (ulong)*(byte *)((long)DTable + uVar11 * 4 + 7);
          lVar3 = uVar5 + lVar2;
          uVar8 = (local_108.bitContainer << ((ulong)uVar6 & 0x3f)) >> 0x35;
          *(short *)(pBVar7 + uVar5 + lVar2) = (short)DTable[uVar8 + 1];
          uVar6 = *(byte *)((long)DTable + uVar8 * 4 + 6) + uVar6;
          uVar5 = (ulong)*(byte *)((long)DTable + uVar8 * 4 + 7);
          uVar8 = (local_108.bitContainer << ((ulong)uVar6 & 0x3f)) >> 0x35;
          *(short *)(pBVar7 + uVar5 + lVar3) = (short)DTable[uVar8 + 1];
          pBVar7 = pBVar7 + (ulong)*(byte *)((long)DTable + uVar8 * 4 + 7) + uVar5 + lVar3;
          uVar5 = (ulong)(*(byte *)((long)DTable + uVar8 * 4 + 6) + uVar6);
        }
        local_108.bitsConsumed = (uint)uVar5;
        uVar8 = (long)dst - (long)pBVar7;
      }
LAB_001de579:
      if (1 < uVar8) {
        while (uVar6 = (uint)uVar5, uVar6 < 0x41) {
          if (local_108.ptr < local_108.limitPtr) {
            if (local_108.ptr == local_108.start) break;
            bVar14 = local_108.start <= (size_t *)((long)local_108.ptr - (uVar5 >> 3));
            uVar8 = (ulong)(uint)((int)local_108.ptr - iVar9);
            if (bVar14) {
              uVar8 = uVar5 >> 3;
            }
            local_108.bitsConsumed = uVar6 + (int)uVar8 * -8;
          }
          else {
            uVar8 = uVar5 >> 3;
            local_108.bitsConsumed = uVar6 & 7;
            bVar14 = true;
          }
          local_108.ptr = (char *)((long)local_108.ptr - uVar8);
          uVar5 = (ulong)local_108.bitsConsumed;
          local_108.bitContainer = *(size_t *)local_108.ptr;
          if (((BYTE *)((long)dst + -2) < pBVar7) || (!bVar14)) break;
          uVar5 = (local_108.bitContainer << (uVar5 & 0x3f)) >> 0x35;
          *(short *)pBVar7 = (short)DTable[uVar5 + 1];
          local_108.bitsConsumed = *(byte *)((long)DTable + uVar5 * 4 + 6) + local_108.bitsConsumed;
          pBVar7 = pBVar7 + *(byte *)((long)DTable + uVar5 * 4 + 7);
          uVar5 = (ulong)local_108.bitsConsumed;
        }
        for (; pBVar7 <= (BYTE *)((long)dst + -2);
            pBVar7 = pBVar7 + *(byte *)((long)DTable + uVar8 * 4 + 7)) {
          uVar8 = (local_108.bitContainer << (uVar5 & 0x3f)) >> 0x35;
          *(short *)pBVar7 = (short)DTable[uVar8 + 1];
          local_108.bitsConsumed = *(byte *)((long)DTable + uVar8 * 4 + 6) + local_108.bitsConsumed;
          uVar5 = (ulong)local_108.bitsConsumed;
        }
      }
      if (pBVar7 < dst) {
        *pBVar7 = (BYTE)DTable[((local_108.bitContainer << (uVar5 & 0x3f)) >> 0x35) + 1];
        pBVar7 = pBVar7 + 1;
      }
      sVar4 = 0xffffffffffffffec;
      pBVar1 = args.op[lVar12];
      args.op[lVar12] = pBVar7 + ((long)pBVar1 - (long)pBVar13);
      lVar12 = lVar12 + 1;
    } while (pBVar7 + ((long)pBVar1 - (long)pBVar13) == (BYTE *)dst);
  }
  return sVar4;
}

Assistant:

static HUF_FAST_BMI2_ATTRS size_t
HUF_decompress4X2_usingDTable_internal_fast(
          void* dst,  size_t dstSize,
    const void* cSrc, size_t cSrcSize,
    const HUF_DTable* DTable,
    HUF_DecompressFastLoopFn loopFn) {
    void const* dt = DTable + 1;
    const BYTE* const iend = (const BYTE*)cSrc + 6;
    BYTE* const oend = (BYTE*)dst + dstSize;
    HUF_DecompressFastArgs args;
    {
        size_t const ret = HUF_DecompressFastArgs_init(&args, dst, dstSize, cSrc, cSrcSize, DTable);
        FORWARD_IF_ERROR(ret, "Failed to init asm args");
        if (ret == 0)
            return 0;
    }

    assert(args.ip[0] >= args.ilimit);
    loopFn(&args);

    /* note : op4 already verified within main loop */
    assert(args.ip[0] >= iend);
    assert(args.ip[1] >= iend);
    assert(args.ip[2] >= iend);
    assert(args.ip[3] >= iend);
    assert(args.op[3] <= oend);
    (void)iend;

    /* finish bitStreams one by one */
    {
        size_t const segmentSize = (dstSize+3) / 4;
        BYTE* segmentEnd = (BYTE*)dst;
        int i;
        for (i = 0; i < 4; ++i) {
            BIT_DStream_t bit;
            if (segmentSize <= (size_t)(oend - segmentEnd))
                segmentEnd += segmentSize;
            else
                segmentEnd = oend;
            FORWARD_IF_ERROR(HUF_initRemainingDStream(&bit, &args, i, segmentEnd), "corruption");
            args.op[i] += HUF_decodeStreamX2(args.op[i], &bit, segmentEnd, (HUF_DEltX2 const*)dt, HUF_DECODER_FAST_TABLELOG);
            if (args.op[i] != segmentEnd)
                return ERROR(corruption_detected);
        }
    }

    /* decoded size */
    return dstSize;
}